

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_flyweight.cpp
# Opt level: O0

int main(void)

{
  initializer_list<User> __l;
  bool bVar1;
  reference usr_00;
  ostream *this;
  User *local_2d0;
  User *usr;
  iterator __end1;
  iterator __begin1;
  vector<User,_std::allocator<User>_> *__range1;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_b1;
  string local_b0;
  User *local_90;
  User local_88;
  User local_78;
  User local_68;
  User local_58;
  User local_48;
  User local_38;
  undefined1 local_28 [8];
  vector<User,_std::allocator<User>_> users;
  
  users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  __range1._6_1_ = 1;
  local_90 = &local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"John",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Doe",&local_e9);
  User::User(&local_88,&local_b0,&local_e8);
  local_90 = &local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"Mark",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Doe",&local_139);
  User::User(&local_78,&local_110,&local_138);
  local_90 = &local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"Jane",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"Doe",&local_189);
  User::User(&local_68,&local_160,&local_188);
  local_90 = &local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"Mike",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"Doe",&local_1d9);
  User::User(&local_58,&local_1b0,&local_1d8);
  local_90 = &local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"Jill",&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"Doe",(allocator<char> *)((long)&__range1 + 7));
  User::User(&local_48,&local_200,&local_228);
  __range1._6_1_ = 0;
  local_38.m_first_name.h.h = (handle_type)&local_88;
  local_38.m_last_name.h.h =
       (handle_type)
       (refcounted_value<boost::flyweights::detail::default_value_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::rep_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x5;
  std::allocator<User>::allocator((allocator<User> *)((long)&__range1 + 5));
  __l._M_len = (size_type)local_38.m_last_name.h.h;
  __l._M_array = (iterator)local_38.m_first_name.h.h;
  std::vector<User,_std::allocator<User>_>::vector
            ((vector<User,_std::allocator<User>_> *)local_28,__l,
             (allocator<User> *)((long)&__range1 + 5));
  std::allocator<User>::~allocator((allocator<User> *)((long)&__range1 + 5));
  local_2d0 = &local_38;
  do {
    local_2d0 = local_2d0 + -1;
    User::~User(local_2d0);
  } while (local_2d0 != &local_88);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  __end1 = std::vector<User,_std::allocator<User>_>::begin
                     ((vector<User,_std::allocator<User>_> *)local_28);
  usr = (User *)std::vector<User,_std::allocator<User>_>::end
                          ((vector<User,_std::allocator<User>_> *)local_28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>
                                *)&usr);
    if (!bVar1) break;
    usr_00 = __gnu_cxx::__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>::
             operator*(&__end1);
    this = operator<<((ostream *)&std::cout,usr_00);
    std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>::operator++
              (&__end1);
  }
  users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<User,_std::allocator<User>_>::~vector((vector<User,_std::allocator<User>_> *)local_28)
  ;
  return users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main()
{
	std::vector<User> users{
		User{"John", "Doe"},
		User{"Mark", "Doe"},
		User{"Jane", "Doe"},
		User{"Mike", "Doe"},
		User{"Jill", "Doe"},
	};

	for(const auto& usr : users)
	{
		std::cout << usr << std::endl;
	}

	return 0;
}